

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreTexture.h
# Opt level: O1

ECOLOR_FORMAT __thiscall
irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>::getBestColorFormat
          (COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *this,ECOLOR_FORMAT format)

{
  long *plVar1;
  char cVar2;
  ECOLOR_FORMAT EVar3;
  
  EVar3 = ECF_A8R8G8B8;
  if (3 < (int)format) {
    EVar3 = format;
  }
  switch(format) {
  case ECF_A1R5G5B5:
    plVar1 = *(long **)&(this->super_ITexture).field_0x78;
    cVar2 = (**(code **)(*plVar1 + 0x220))(plVar1,2);
    if (cVar2 == '\0') {
      EVar3 = ECF_A1R5G5B5;
    }
    break;
  case ECF_R5G6B5:
    plVar1 = *(long **)&(this->super_ITexture).field_0x78;
    cVar2 = (**(code **)(*plVar1 + 0x220))(plVar1,2);
    if (cVar2 == '\0') {
      EVar3 = ECF_R5G6B5;
    }
    break;
  case ECF_R8G8B8:
  case ECF_A8R8G8B8:
    plVar1 = *(long **)&(this->super_ITexture).field_0x78;
    cVar2 = (**(code **)(*plVar1 + 0x220))(plVar1,1);
    if ((cVar2 != '\0') ||
       (plVar1 = *(long **)&(this->super_ITexture).field_0x78,
       cVar2 = (**(code **)(*plVar1 + 0x220))(plVar1,8), cVar2 != '\0')) {
      EVar3 = ECF_A1R5G5B5;
    }
  }
  plVar1 = *(long **)&(this->super_ITexture).field_0x78;
  cVar2 = (**(code **)(*plVar1 + 0x220))(plVar1,0x20);
  if (cVar2 != '\0') {
    if (EVar3 == ECF_A8R8G8B8) {
      EVar3 = ECF_R8G8B8;
    }
    else if (EVar3 == ECF_A1R5G5B5) {
      EVar3 = ECF_R5G6B5;
    }
  }
  return EVar3;
}

Assistant:

ECOLOR_FORMAT getBestColorFormat(ECOLOR_FORMAT format)
	{
		// We only try for to adapt "simple" formats
		ECOLOR_FORMAT destFormat = (format <= ECF_A8R8G8B8) ? ECF_A8R8G8B8 : format;

		switch (format) {
		case ECF_A1R5G5B5:
			if (!Driver->getTextureCreationFlag(ETCF_ALWAYS_32_BIT))
				destFormat = ECF_A1R5G5B5;
			break;
		case ECF_R5G6B5:
			if (!Driver->getTextureCreationFlag(ETCF_ALWAYS_32_BIT))
				destFormat = ECF_R5G6B5;
			break;
		case ECF_A8R8G8B8:
			if (Driver->getTextureCreationFlag(ETCF_ALWAYS_16_BIT) ||
					Driver->getTextureCreationFlag(ETCF_OPTIMIZED_FOR_SPEED))
				destFormat = ECF_A1R5G5B5;
			break;
		case ECF_R8G8B8:
			// Note: Using ECF_A8R8G8B8 even when ETCF_ALWAYS_32_BIT is not set as 24 bit textures fail with too many cards
			if (Driver->getTextureCreationFlag(ETCF_ALWAYS_16_BIT) || Driver->getTextureCreationFlag(ETCF_OPTIMIZED_FOR_SPEED))
				destFormat = ECF_A1R5G5B5;
		default:
			break;
		}

		if (Driver->getTextureCreationFlag(ETCF_NO_ALPHA_CHANNEL)) {
			switch (destFormat) {
			case ECF_A1R5G5B5:
				destFormat = ECF_R5G6B5;
				break;
			case ECF_A8R8G8B8:
				destFormat = ECF_R8G8B8;
				break;
			default:
				break;
			}
		}

		return destFormat;
	}